

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_impl.hpp
# Opt level: O2

sequence * toml::detail::syntax::zero_prefixable_int(sequence *__return_storage_ptr__,spec *s)

{
  repeat_at_least rStack_c8;
  digit local_b0;
  either local_98;
  sequence local_78;
  character local_58;
  digit local_48;
  digit local_30;
  
  local_b0.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__digit_004cd7d0;
  local_b0.scanner_.super_scanner_base._vptr_scanner_base =
       (_func_int **)&PTR__scanner_base_004cc9a0;
  local_b0.scanner_.from_ = '0';
  local_b0.scanner_.to_ = '9';
  local_30.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__digit_004cd7d0;
  local_30.scanner_.super_scanner_base._vptr_scanner_base =
       (_func_int **)&PTR__scanner_base_004cc9a0;
  local_30.scanner_.from_ = '0';
  local_30.scanner_.to_ = '9';
  local_58.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__scanner_base_004cc8e0;
  local_58.value_ = '_';
  local_48.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__digit_004cd7d0;
  local_48.scanner_.super_scanner_base._vptr_scanner_base =
       (_func_int **)&PTR__scanner_base_004cc9a0;
  local_48.scanner_.from_ = '0';
  local_48.scanner_.to_ = '9';
  sequence::sequence<toml::detail::character,toml::detail::syntax::digit>
            (&local_78,&local_58,&local_48);
  either::either<toml::detail::syntax::digit,toml::detail::sequence>(&local_98,&local_30,&local_78);
  repeat_at_least::repeat_at_least<toml::detail::either>(&rStack_c8,0,&local_98);
  sequence::sequence<toml::detail::syntax::digit,toml::detail::repeat_at_least>
            (__return_storage_ptr__,&local_b0,&rStack_c8);
  if ((_Head_base<0UL,_toml::detail::scanner_base_*,_false>)
      rStack_c8.other_.scanner_._M_t.
      super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
      ._M_t.
      super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
      .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl !=
      (_Head_base<0UL,_toml::detail::scanner_base_*,_false>)0x0) {
    (*(*(_func_int ***)
        rStack_c8.other_.scanner_._M_t.
        super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
        ._M_t.
        super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
        .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl)[1])();
  }
  rStack_c8.other_.scanner_._M_t.
  super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
  ._M_t.
  super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
  .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl =
       (unique_ptr<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>)
       (__uniq_ptr_data<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>,_true,_true>
        )0x0;
  std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
  ~vector(&local_98.others_);
  std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
  ~vector(&local_78.others_);
  return __return_storage_ptr__;
}

Assistant:

TOML11_INLINE sequence zero_prefixable_int(const spec& s)
{
    return sequence(
            digit(s),
            repeat_at_least(0,
                either(
                    digit(s),
                    sequence(character('_'), digit(s))
                )
            )
        );
}